

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadNPos(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int iEod;
  int iOff;
  int nSz;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)in_RDI + 0x3c) == 0) {
    iVar3 = (int)*(undefined8 *)(in_RSI + 0x20);
    if (*(int *)(*in_RDI + 0x74) == 1) {
      if (*(int *)(in_RSI + 0x44) < *(int *)(*(long *)(in_RSI + 0x10) + 0xc)) {
        iVar5 = *(int *)(in_RSI + 0x44);
      }
      else {
        iVar5 = *(int *)(*(long *)(in_RSI + 0x10) + 0xc);
      }
      *(undefined1 *)(in_RSI + 0x7c) = 0;
      *(undefined4 *)(in_RSI + 0x78) = 1;
      iVar4 = iVar3;
      if ((iVar3 < iVar5) && (*(char *)(**(long **)(in_RSI + 0x10) + (long)iVar3) == '\0')) {
        *(undefined1 *)(in_RSI + 0x7c) = 1;
        iVar4 = iVar3 + 1;
        if ((iVar4 < iVar5) && (*(char *)(**(long **)(in_RSI + 0x10) + (long)iVar4) == '\0')) {
          *(undefined4 *)(in_RSI + 0x78) = 1;
          iVar4 = iVar3 + 2;
        }
        else {
          *(undefined4 *)(in_RSI + 0x78) = 0;
        }
      }
    }
    else {
      iVar4 = iVar3 + 1;
      bVar1 = *(byte *)(**(long **)(in_RSI + 0x10) + (long)iVar3);
      if ((bVar1 & 0x80) != 0) {
        iVar4 = sqlite3Fts5GetVarint32
                          ((uchar *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                           (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        iVar4 = iVar4 + iVar3;
      }
      *(byte *)(in_RSI + 0x7c) = bVar1 & 1;
      *(int *)(in_RSI + 0x78) = (int)(uint)bVar1 >> 1;
    }
    *(long *)(in_RSI + 0x20) = (long)iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5SegIterLoadNPos(Fts5Index *p, Fts5SegIter *pIter){
  if( p->rc==SQLITE_OK ){
    int iOff = pIter->iLeafOffset;  /* Offset to read at */
    ASSERT_SZLEAF_OK(pIter->pLeaf);
    if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
      int iEod = MIN(pIter->iEndofDoclist, pIter->pLeaf->szLeaf);
      pIter->bDel = 0;
      pIter->nPos = 1;
      if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
        pIter->bDel = 1;
        iOff++;
        if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
          pIter->nPos = 1;
          iOff++;
        }else{
          pIter->nPos = 0;
        }
      }
    }else{
      int nSz;
      fts5FastGetVarint32(pIter->pLeaf->p, iOff, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
    pIter->iLeafOffset = iOff;
  }
}